

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O3

int add_link(archive_read *a,xar *xar,xar_file *file)

{
  hdlink *phVar1;
  hdlink **pphVar2;
  
  pphVar2 = &xar->hdlink_list;
  phVar1 = (hdlink *)pphVar2;
  do {
    phVar1 = phVar1->next;
    if (phVar1 == (hdlink *)0x0) {
      phVar1 = (hdlink *)malloc(0x18);
      if (phVar1 != (hdlink *)0x0) {
        file->hdnext = (xar_file *)0x0;
        phVar1->id = file->link;
        phVar1->cnt = 1;
        phVar1->files = file;
        phVar1->next = *pphVar2;
        *pphVar2 = phVar1;
        return 0;
      }
      archive_set_error(&a->archive,0xc,"Out of memory");
      return -0x1e;
    }
  } while (phVar1->id != file->link);
  file->hdnext = phVar1->files;
  phVar1->cnt = phVar1->cnt + 1;
  phVar1->files = file;
  return 0;
}

Assistant:

static int
add_link(struct archive_read *a, struct xar *xar, struct xar_file *file)
{
	struct hdlink *hdlink;

	for (hdlink = xar->hdlink_list; hdlink != NULL; hdlink = hdlink->next) {
		if (hdlink->id == file->link) {
			file->hdnext = hdlink->files;
			hdlink->cnt++;
			hdlink->files = file;
			return (ARCHIVE_OK);
		}
	}
	hdlink = malloc(sizeof(*hdlink));
	if (hdlink == NULL) {
		archive_set_error(&a->archive, ENOMEM, "Out of memory");
		return (ARCHIVE_FATAL);
	}
	file->hdnext = NULL;
	hdlink->id = file->link;
	hdlink->cnt = 1;
	hdlink->files = file;
	hdlink->next = xar->hdlink_list;
	xar->hdlink_list = hdlink;
	return (ARCHIVE_OK);
}